

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O2

void __thiscall
Assimp::FBX::Node::AddP70<double,double,double>
          (Node *this,string *name,string *type,string *type2,string *flags,double more,
          double more_1,double more_2)

{
  Node n;
  allocator<char> local_151;
  double local_150;
  double local_148;
  double local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  Node local_98;
  
  local_150 = more;
  local_148 = more_1;
  local_140 = more_2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"P",&local_151);
  Node(&local_98,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string((string *)&local_d8,(string *)name);
  std::__cxx11::string::string((string *)&local_f8,(string *)type);
  std::__cxx11::string::string((string *)&local_118,(string *)type2);
  std::__cxx11::string::string((string *)&local_138,(string *)flags);
  AddProperties<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,double,double,double>
            (&local_98,&local_d8,&local_f8,&local_118,&local_138,local_150,local_148,local_140);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&this->children,&local_98);
  ~Node(&local_98);
  return;
}

Assistant:

void AddP70(
        const std::string& name,
        const std::string& type,
        const std::string& type2,
        const std::string& flags,
        More... more
    ) {
        Node n("P");
        n.AddProperties(name, type, type2, flags, more...);
        AddChild(n);
    }